

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Matrix * rw::Matrix::mult(Matrix *dst,Matrix *src1,Matrix *src2)

{
  float32 fVar1;
  float32 fVar2;
  float32 fVar3;
  uint32 uVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  uint32 uVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  uint32 uVar12;
  float32 fVar13;
  float32 fVar14;
  float32 fVar15;
  uint32 uVar16;
  
  if ((src1->flags & 0x20000) == 0) {
    if ((src2->flags & 0x20000) == 0) {
      mult_(dst,src1,src2);
      dst->flags = src2->flags & src1->flags;
      return dst;
    }
    fVar1 = (src1->right).x;
    fVar2 = (src1->right).y;
    fVar3 = (src1->right).z;
    uVar4 = src1->flags;
    fVar5 = (src1->up).x;
    fVar6 = (src1->up).y;
    fVar7 = (src1->up).z;
    uVar8 = src1->pad1;
    fVar9 = (src1->at).x;
    fVar10 = (src1->at).y;
    fVar11 = (src1->at).z;
    uVar12 = src1->pad2;
    fVar13 = (src1->pos).x;
    fVar14 = (src1->pos).y;
    fVar15 = (src1->pos).z;
    uVar16 = src1->pad3;
  }
  else {
    fVar1 = (src2->right).x;
    fVar2 = (src2->right).y;
    fVar3 = (src2->right).z;
    uVar4 = src2->flags;
    fVar5 = (src2->up).x;
    fVar6 = (src2->up).y;
    fVar7 = (src2->up).z;
    uVar8 = src2->pad1;
    fVar9 = (src2->at).x;
    fVar10 = (src2->at).y;
    fVar11 = (src2->at).z;
    uVar12 = src2->pad2;
    fVar13 = (src2->pos).x;
    fVar14 = (src2->pos).y;
    fVar15 = (src2->pos).z;
    uVar16 = src2->pad3;
  }
  (dst->pos).x = fVar13;
  (dst->pos).y = fVar14;
  (dst->pos).z = fVar15;
  dst->pad3 = uVar16;
  (dst->at).x = fVar9;
  (dst->at).y = fVar10;
  (dst->at).z = fVar11;
  dst->pad2 = uVar12;
  (dst->up).x = fVar5;
  (dst->up).y = fVar6;
  (dst->up).z = fVar7;
  dst->pad1 = uVar8;
  (dst->right).x = fVar1;
  (dst->right).y = fVar2;
  (dst->right).z = fVar3;
  dst->flags = uVar4;
  return dst;
}

Assistant:

Matrix*
Matrix::mult(Matrix *dst, const Matrix *src1, const Matrix *src2)
{
	if(src1->flags & IDENTITY)
		*dst = *src2;
	else if(src2->flags & IDENTITY)
		*dst = *src1;
	else{
		mult_(dst, src1, src2);
		dst->flags = src1->flags & src2->flags;
	}
	return dst;
}